

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_req_handlers.cxx
# Opt level: O0

ptr<resp_msg> __thiscall
cornerstone::raft_server::handle_prevote_req(raft_server *this,req_msg *req)

{
  int iVar1;
  element_type *peVar2;
  ulong uVar3;
  element_type *peVar4;
  element_type *peVar5;
  ulong uVar6;
  undefined4 extraout_var;
  socklen_t *__addr_len;
  socklen_t *psVar7;
  pointer prVar8;
  element_type *this_00;
  req_msg *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  sockaddr *__addr;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  element_type *in_RDI;
  bool bVar10;
  ptr<resp_msg> pVar11;
  bool grant;
  bool log_okay;
  ptr<resp_msg> *resp;
  int *in_stack_ffffffffffffff00;
  undefined6 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0e;
  undefined1 in_stack_ffffffffffffff0f;
  byte bVar12;
  msg_type *in_stack_ffffffffffffff10;
  unsigned_long *in_stack_ffffffffffffff18;
  bool local_b9;
  bool local_a1;
  bool local_6a;
  undefined1 local_68 [16];
  undefined1 local_58 [39];
  byte local_31;
  int32 local_30;
  undefined4 local_2c;
  ulong local_28;
  undefined1 local_19;
  req_msg *local_18;
  
  local_19 = 0;
  local_18 = in_RDX;
  peVar2 = std::
           __shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1d6790);
  local_28 = srv_state::get_term(peVar2);
  local_2c = 0x13;
  local_30 = msg_base::get_src(&local_18->super_msg_base);
  cs_new<cornerstone::resp_msg,unsigned_long,cornerstone::msg_type,int&,int>
            (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
             (int *)CONCAT17(in_stack_ffffffffffffff0f,
                             CONCAT16(in_stack_ffffffffffffff0e,in_stack_ffffffffffffff08)),
             in_stack_ffffffffffffff00);
  bVar10 = false;
  uVar3 = req_msg::get_last_log_term(local_18);
  peVar4 = std::
           __shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1d6830);
  (*peVar4->_vptr_log_store[4])(local_58);
  peVar5 = std::
           __shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1d6853);
  uVar6 = log_entry::get_term(peVar5);
  local_a1 = true;
  if (uVar3 <= uVar6) {
    uVar3 = req_msg::get_last_log_term(local_18);
    peVar4 = std::
             __shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1d68a3);
    (*peVar4->_vptr_log_store[4])(local_68);
    bVar10 = true;
    peVar5 = std::
             __shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1d68ce);
    uVar6 = log_entry::get_term(peVar5);
    local_b9 = false;
    if (uVar3 == uVar6) {
      peVar4 = std::
               __shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1d6903);
      iVar1 = (*peVar4->_vptr_log_store[2])();
      uVar3 = req_msg::get_last_log_idx(local_18);
      local_b9 = CONCAT44(extraout_var,iVar1) - 1U <= uVar3;
    }
    local_a1 = local_b9;
  }
  if (bVar10) {
    std::shared_ptr<cornerstone::log_entry>::~shared_ptr
              ((shared_ptr<cornerstone::log_entry> *)0x1d6974);
  }
  std::shared_ptr<cornerstone::log_entry>::~shared_ptr
            ((shared_ptr<cornerstone::log_entry> *)0x1d6981);
  local_31 = local_a1;
  __addr_len = (socklen_t *)msg_base::get_term(&local_18->super_msg_base);
  peVar2 = std::
           __shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1d69b3);
  psVar7 = (socklen_t *)srv_state::get_term(peVar2);
  bVar12 = 0;
  if (psVar7 <= __addr_len) {
    bVar12 = local_31;
  }
  local_6a = (bool)(bVar12 & 1);
  std::unique_ptr<cornerstone::context,_std::default_delete<cornerstone::context>_>::operator->
            ((unique_ptr<cornerstone::context,_std::default_delete<cornerstone::context>_> *)
             0x1d69fd);
  prVar8 = std::unique_ptr<cornerstone::raft_params,_std::default_delete<cornerstone::raft_params>_>
           ::operator->((unique_ptr<cornerstone::raft_params,_std::default_delete<cornerstone::raft_params>_>
                         *)0x1d6a09);
  _Var9._M_pi = extraout_RDX;
  if (((prVar8->defensive_prevote_ & 1U) != 0) &&
     (bVar10 = local_6a != false, local_6a = false, bVar10)) {
    local_6a = std::unique_ptr::operator_cast_to_bool
                         ((unique_ptr<cornerstone::prevote_state,_std::default_delete<cornerstone::prevote_state>_>
                           *)0x1d6a34);
    _Var9._M_pi = extraout_RDX_00;
  }
  if (local_6a != false) {
    this_00 = std::
              __shared_ptr_access<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1d6acb);
    peVar4 = std::
             __shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1d6ae0);
    iVar1 = (*peVar4->_vptr_log_store[2])();
    resp_msg::accept(this_00,iVar1,__addr,__addr_len);
    _Var9._M_pi = extraout_RDX_01;
  }
  pVar11.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var9._M_pi;
  pVar11.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ptr<resp_msg>)pVar11.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

ptr<resp_msg> raft_server::handle_prevote_req(req_msg& req)
{
    ptr<resp_msg> resp(cs_new<resp_msg>(state_->get_term(), msg_type::prevote_response, id_, req.get_src()));
    bool log_okay = req.get_last_log_term() > log_store_->last_entry()->get_term() ||
                    (req.get_last_log_term() == log_store_->last_entry()->get_term() &&
                     log_store_->next_slot() - 1 <= req.get_last_log_idx());
    bool grant = req.get_term() >= state_->get_term() && log_okay;
    if (ctx_->params_->defensive_prevote_)
    {
        // In defensive mode, server will deny the prevote when it's operating well.
        grant = grant && prevote_state_;
    }

    if (grant)
    {
        resp->accept(log_store_->next_slot());
    }

    return resp;
}